

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMergingMethods
          (MessageGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  csharp *this_00;
  mapped_type *pmVar4;
  FieldGeneratorBase *pFVar5;
  Descriptor *pDVar6;
  char *pcVar7;
  pointer ppFVar8;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar9;
  FieldDescriptor *extraout_RDX_00;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_b8 [32];
  string local_98;
  long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  lVar11 = **(long **)this->descriptor_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,lVar11,(*(long **)this->descriptor_)[1] + lVar11);
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"class_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,(key_type *)local_b8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_98);
  if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,"public void MergeFrom($class_name$ other) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (other == null) {\n  return;\n}\n");
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x68)) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      if (*(long *)(*(long *)(pDVar6 + 0x28) + 0x58 + lVar12) == 0) {
        pFVar5 = CreateFieldGeneratorInternal
                           (this,(FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + lVar12));
        (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar5,printer);
        (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar5);
      }
      lVar11 = lVar11 + 1;
      pDVar6 = this->descriptor_;
      lVar12 = lVar12 + 0x98;
    } while (lVar11 < *(int *)(pDVar6 + 0x68));
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 0x6c)) {
    lVar11 = 0;
    do {
      lVar12 = lVar11 * 0x30;
      UnderscoresToCamelCase(&local_98,*(string **)(*(long *)(pDVar6 + 0x30) + lVar12),false,false);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"name","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,(key_type *)local_b8);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_98);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      UnderscoresToCamelCase
                (&local_98,*(string **)(*(long *)(this->descriptor_ + 0x30) + lVar12),true,false);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"property_name","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_60,(key_type *)local_b8);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_98);
      if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      local_68 = lVar11;
      io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_60,"switch (other.$property_name$Case) {\n");
      io::Printer::Indent(printer);
      lVar11 = *(long *)(this->descriptor_ + 0x30);
      if (0 < *(int *)(lVar11 + 0x18 + lVar12)) {
        lVar10 = 0;
        pFVar9 = extraout_RDX;
        do {
          this_00 = *(csharp **)(*(long *)(lVar11 + 0x20 + lVar12) + lVar10 * 8);
          GetPropertyName_abi_cxx11_(&local_98,this_00,pFVar9);
          local_b8._0_8_ = local_b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"field_property_name","");
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,(key_type *)local_b8);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_98);
          if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_60,
                             "case $property_name$OneofCase.$field_property_name$:\n");
          io::Printer::Indent(printer);
          pFVar5 = CreateFieldGeneratorInternal(this,(FieldDescriptor *)this_00);
          (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar5,printer);
          io::Printer::Print<>(printer,"break;\n");
          io::Printer::Outdent(printer);
          (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar5);
          lVar10 = lVar10 + 1;
          lVar11 = *(long *)(this->descriptor_ + 0x30);
          pFVar9 = extraout_RDX_00;
        } while (lVar10 < *(int *)(lVar11 + 0x18 + lVar12));
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"}\n\n");
      lVar11 = local_68 + 1;
      pDVar6 = this->descriptor_;
    } while (lVar11 < *(int *)(pDVar6 + 0x6c));
  }
  if (this->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }
  io::Printer::Print<>
            (printer,
             "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n"
            );
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public void MergeFrom(pb::CodedInputStream input) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>
            (printer,"uint tag;\nwhile ((tag = input.ReadTag()) != 0) {\n  switch(tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (this->end_tag_ != 0) {
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    pcVar7 = FastUInt32ToBufferLeft(this->end_tag_,paVar1->_M_local_buf);
    local_98._M_string_length = (long)pcVar7 - (long)paVar1;
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,local_98._M_dataplus._M_p,
               local_98._M_dataplus._M_p + local_98._M_string_length);
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,"$end_tag$:\n  return;\n",(char (*) [8])"end_tag",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  pcVar7 = 
  "default:\n  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n  break;\n"
  ;
  if (this->has_extension_ranges_ != false) {
    pcVar7 = 
    "default:\n  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, input)) {\n    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n  }\n  break;\n"
    ;
  }
  io::Printer::Print<>(printer,pcVar7);
  ppFVar8 = (this->fields_by_number_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->fields_by_number_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
    uVar13 = 0;
    do {
      pFVar9 = ppFVar8[uVar13];
      if (*(once_flag **)(pFVar9 + 0x30) != (once_flag *)0x0) {
        local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b8._0_8_ = pFVar9;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar9 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_98,
                   (FieldDescriptor **)local_b8);
      }
      iVar2 = *(int *)(pFVar9 + 0x44);
      uVar3 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                       (ulong)*(uint *)(pFVar9 + 0x38) * 4);
      if (*(int *)(pFVar9 + 0x3c) == 3) {
        if (*(once_flag **)(pFVar9 + 0x30) != (once_flag *)0x0) {
          local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_b8._0_8_ = pFVar9;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar9 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_98,
                     (FieldDescriptor **)local_b8);
        }
        if (*(int *)(pFVar9 + 0x38) - 0xdU < 0xfffffffc) {
          paVar1 = &local_98.field_2;
          local_98._M_dataplus._M_p = (pointer)paVar1;
          pcVar7 = FastUInt32ToBufferLeft(*(int *)(pFVar9 + 0x44) * 8 + 2,paVar1->_M_local_buf);
          local_98._M_string_length = (long)pcVar7 - (long)paVar1;
          local_b8._0_8_ = local_b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,"case $packed_tag$:\n",(char (*) [11])"packed_tag",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
          if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_);
          }
        }
      }
      paVar1 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      pcVar7 = FastUInt32ToBufferLeft(iVar2 << 3 | uVar3,paVar1->_M_local_buf);
      local_98._M_string_length = (long)pcVar7 - (long)paVar1;
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      io::Printer::Print<char[4],std::__cxx11::string>
                (printer,"case $tag$: {\n",(char (*) [4])0x3b211b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      if ((FieldDescriptor *)local_b8._0_8_ != (FieldDescriptor *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
      io::Printer::Indent(printer);
      pFVar5 = CreateFieldGeneratorInternal(this,pFVar9);
      (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[8])(pFVar5,printer);
      io::Printer::Print<>(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"}\n");
      (*(pFVar5->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar5);
      uVar13 = uVar13 + 1;
      ppFVar8 = (this->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->fields_by_number_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3)
            );
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageGenerator::GenerateMergingMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  std::map<string, string> vars;
  vars["class_name"] = class_name();

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public void MergeFrom($class_name$ other) {\n");
  printer->Indent();
  printer->Print(
    "if (other == null) {\n"
    "  return;\n"
    "}\n");
  // Merge non-oneof fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      std::unique_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->field(i)));
      generator->GenerateMergingCode(printer);
    }
  }
  // Merge oneof fields
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
        vars,
        "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      generator->GenerateMergingCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  // Merge extensions
  if (has_extension_ranges_) {
    printer->Print("pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }

  // Merge unknown fields.
  printer->Print(
      "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n");

  printer->Outdent();
  printer->Print("}\n\n");


  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void MergeFrom(pb::CodedInputStream input) {\n");
  printer->Indent();
  printer->Print(
    "uint tag;\n"
    "while ((tag = input.ReadTag()) != 0) {\n"
    "  switch(tag) {\n");
  printer->Indent();
  printer->Indent();
  if (end_tag_ != 0) {
    printer->Print(
      "$end_tag$:\n"
      "  return;\n",
      "end_tag", StrCat(end_tag_));
  }
  if (has_extension_ranges_) {
    printer->Print(
      "default:\n"
      "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, input)) {\n"
      "    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n"
      "  }\n"
      "  break;\n");
  } else {
    printer->Print(
      "default:\n"
      "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n"
      "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32 tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array call;
    // the two generated cases are the packed and unpacked tags.
    // TODO(jonskeet): Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print(
        "case $packed_tag$:\n",
        "packed_tag",
        StrCat(
            internal::WireFormatLite::MakeTag(
                field->number(),
                internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n"); // switch
  printer->Outdent();
  printer->Print("}\n"); // while
  printer->Outdent();
  printer->Print("}\n\n"); // method
}